

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::Clear
          (BayesianProbitRegressor_Gaussian *this)

{
  this->mean_ = 0.0;
  this->precision_ = 0.0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor_Gaussian::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&mean_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&precision_) -
      reinterpret_cast<char*>(&mean_)) + sizeof(precision_));
  _internal_metadata_.Clear<std::string>();
}